

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::ConcatNode::IsCharTrieArm(ConcatNode *this,Compiler *compiler,uint *accNumAlts)

{
  int iVar1;
  ConcatNode *curr;
  
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  for (; this != (ConcatNode *)0x0; this = this->tail) {
    iVar1 = (*this->head->_vptr_Node[0x14])(this->head,compiler,accNumAlts);
    if ((char)iVar1 == '\0') break;
  }
  return this == (ConcatNode *)0x0;
}

Assistant:

bool ConcatNode::IsCharTrieArm(Compiler& compiler, uint& accNumAlts) const
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        for (const ConcatNode* curr = this; curr != 0; curr = curr->tail)
        {
            if (!curr->head->IsCharTrieArm(compiler, accNumAlts))
                return false;
        }
        return true;
    }